

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_ssm_scan(ggml_compute_params *params,ggml_tensor *dst)

{
  long in_RSI;
  ggml_tensor *in_stack_000000d8;
  ggml_compute_params *in_stack_000000e0;
  
  if (**(int **)(in_RSI + 0x98) == 0) {
    ggml_compute_forward_ssm_scan_f32(in_stack_000000e0,in_stack_000000d8);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
             ,0x1da7,"fatal error");
}

Assistant:

void ggml_compute_forward_ssm_scan(
        const ggml_compute_params * params,
        ggml_tensor * dst) {
    switch (dst->src[0]->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_ssm_scan_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}